

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall TEST_SimpleString_Addition_Test::testBody(TEST_SimpleString_Addition_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  undefined1 local_60 [8];
  SimpleString s4;
  SimpleString s3;
  undefined1 local_30 [8];
  SimpleString s2;
  SimpleString s1;
  TEST_SimpleString_Addition_Test *this_local;
  
  SimpleString::SimpleString((SimpleString *)&s2.bufferSize_,"hello!");
  SimpleString::SimpleString((SimpleString *)local_30,"goodbye!");
  SimpleString::SimpleString((SimpleString *)&s4.bufferSize_,"hello!goodbye!");
  SimpleString::SimpleString((SimpleString *)local_60,"");
  SimpleString::operator+(&local_70,(SimpleString *)&s2.bufferSize_);
  SimpleString::operator=((SimpleString *)local_60,&local_70);
  SimpleString::~SimpleString(&local_70);
  bVar1 = operator!=((SimpleString *)&s4.bufferSize_,(SimpleString *)local_60);
  if (bVar1) {
    bVar1 = operator!=((SimpleString *)local_60,(SimpleString *)local_60);
    if (bVar1) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x139);
    }
    bVar1 = operator!=((SimpleString *)&s4.bufferSize_,(SimpleString *)&s4.bufferSize_);
    if (bVar1) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x139);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(&local_80);
    pcVar2 = SimpleString::asCharString(&local_80);
    StringFrom(&local_90);
    pcVar3 = SimpleString::asCharString(&local_90);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar2,pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x139,pTVar5);
    SimpleString::~SimpleString(&local_90);
    SimpleString::~SimpleString(&local_80);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x139,pTVar5);
  }
  SimpleString::~SimpleString((SimpleString *)local_60);
  SimpleString::~SimpleString((SimpleString *)&s4.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)local_30);
  SimpleString::~SimpleString((SimpleString *)&s2.bufferSize_);
  return;
}

Assistant:

TEST(SimpleString, Addition)
{
    SimpleString s1("hello!");
    SimpleString s2("goodbye!");
    SimpleString s3("hello!goodbye!");
    SimpleString s4;
    s4 = s1 + s2;

    CHECK_EQUAL(s3, s4);
}